

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O0

map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
* __thiscall
flatbuffers::BinaryAnnotator::Annotate
          (map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
           *__return_storage_ptr__,BinaryAnnotator *this)

{
  bool bVar1;
  uint64_t offset;
  Object *table;
  uint64_t root_table_offset;
  Verifier verifier;
  BinaryAnnotator *this_local;
  
  verifier.flex_reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  if (((this->bfbs_ == (uint8_t *)0x0) || (this->bfbs_length_ == 0)) ||
     (((VerifierTemplate<false>::VerifierTemplate
                  ((VerifierTemplate<false> *)&root_table_offset,this->bfbs_,this->bfbs_length_,0x40
                   ,1000000,true), (this->is_size_prefixed_ & 1U) == 0 ||
       (bVar1 = reflection::VerifySizePrefixedSchemaBuffer((Verifier *)&root_table_offset), bVar1))
      && (bVar1 = reflection::VerifySchemaBuffer((Verifier *)&root_table_offset), bVar1)))) {
    if (this->binary_length_ < 0xc) {
      memset(__return_storage_ptr__,0,0x30);
      std::
      map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
      ::map(__return_storage_ptr__);
    }
    else {
      std::
      map<unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>_>_>_>
      ::clear(&this->vtables_);
      std::
      map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
      ::clear(&this->sections_);
      offset = BuildHeader(this,0);
      bVar1 = IsValidOffset(this,offset);
      if (bVar1) {
        table = RootTable(this);
        BuildTable(this,offset,RootTable,table);
      }
      FixMissingRegions(this);
      FixMissingSections(this);
      std::
      map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
      ::map(__return_storage_ptr__,&this->sections_);
    }
  }
  else {
    memset(__return_storage_ptr__,0,0x30);
    std::
    map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
    ::map(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<uint64_t, BinarySection> BinaryAnnotator::Annotate() {
  if (bfbs_ != nullptr && bfbs_length_ != 0) {
    flatbuffers::Verifier verifier(bfbs_, static_cast<size_t>(bfbs_length_));
    if ((is_size_prefixed_ &&
         !reflection::VerifySizePrefixedSchemaBuffer(verifier)) ||
        !reflection::VerifySchemaBuffer(verifier)) {
      return {};
    }
  }

  // The binary is too short to read as a flatbuffers.
  if (binary_length_ < FLATBUFFERS_MIN_BUFFER_SIZE) { return {}; }

  // Make sure we start with a clean slate.
  vtables_.clear();
  sections_.clear();

  // First parse the header region which always start at offset 0.
  // The returned offset will point to the root_table location.
  const uint64_t root_table_offset = BuildHeader(0);

  if (IsValidOffset(root_table_offset)) {
    // Build the root table, and all else will be referenced from it.
    BuildTable(root_table_offset, BinarySectionType::RootTable, RootTable());
  }

  // Now that all the sections are built, make sure the binary sections are
  // contiguous.
  FixMissingRegions();

  // Then scan the area between BinarySections insert padding sections that are
  // implied.
  FixMissingSections();

  return sections_;
}